

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderPrimitiveCounter.cpp
# Opt level: O0

IterateResult __thiscall
glcts::GeometryShaderPrimitiveCounter::iterate(GeometryShaderPrimitiveCounter *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  NotSupportedError *this_00;
  ulong uVar3;
  GLint *feedbackResult_00;
  GLint *feedbackResult;
  GeometryShaderPrimitiveCounter *this_local;
  
  if (((this->super_TestCaseBase).m_is_geometry_shader_extension_supported & 1U) != 0) {
    createAndBuildProgramWithFeedback(this);
    prepareBufferObjects(this);
    auVar1 = ZEXT416(this->m_sizeOfFeedbackBuffer) * ZEXT816(4);
    uVar3 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    feedbackResult_00 = (GLint *)operator_new__(uVar3);
    drawAndGetFeedback(this,feedbackResult_00);
    bVar2 = checkResult(this,feedbackResult_00);
    if (bVar2) {
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_FAIL,"Fail");
    }
    if ((feedbackResult_00 != (GLint *)0x0) && (feedbackResult_00 != (GLint *)0x0)) {
      operator_delete__(feedbackResult_00);
    }
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Geometry shader functionality not supported, skipping","",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveCounter.cpp"
             ,0x30a);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderPrimitiveCounter::iterate(void)
{
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Set up */
	glw::GLint* feedbackResult = NULL;

	createAndBuildProgramWithFeedback();
	prepareBufferObjects();

	feedbackResult = new glw::GLint[m_sizeOfFeedbackBuffer];

	/* Execute the test */
	drawAndGetFeedback(feedbackResult);

	/* Set the CTS test result, depending on the outcome */
	if (checkResult(feedbackResult))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	if (feedbackResult != NULL)
	{
		delete[] feedbackResult;

		feedbackResult = DE_NULL;
	}

	return STOP;
}